

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O2

GrowingAlignedDataBuffer * __thiscall
siamese::EncoderPacketWindow::GetSum
          (EncoderPacketWindow *this,uint laneIndex,uint sumIndex,uint elementEnd)

{
  ostringstream *this_00;
  GrowingAlignedDataBuffer *this_01;
  uint uVar1;
  uint uVar2;
  EncoderSubwindow *pEVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  OutputWorker *this_02;
  uint8_t y;
  uint uVar7;
  OriginalPacket *pOVar8;
  LogStringBuffer local_1b8;
  
  uVar7 = this->Lanes[laneIndex].NextElement[sumIndex];
  if (uVar7 < elementEnd) {
    uVar1 = this->Lanes[laneIndex].LongestPacket;
    this_01 = this->Lanes[laneIndex].Sum + sumIndex;
    if ((uVar1 == 0) ||
       (bVar5 = GrowingAlignedDataBuffer::GrowZeroPadded(this_01,this->TheAllocator,uVar1), bVar5))
    {
      this_00 = &local_1b8.LogStream;
      do {
        if (DAT_0019e278 < 3) {
          local_1b8.ChannelName = Logger;
          local_1b8.LogLevel = Info;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
          std::operator<<((ostream *)this_00,(string *)&DAT_0019e2a8);
          std::operator<<((ostream *)this_00,"Lane ");
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::operator<<((ostream *)this_00," sum ");
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::operator<<((ostream *)this_00," accumulating column: ");
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          this_02 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(this_02,&local_1b8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
        }
        pEVar3 = (this->Subwindows).DataPtr[uVar7 >> 6];
        uVar6 = uVar7 & 0x3f;
        uVar1 = (pEVar3->Originals)._M_elems[uVar6].Buffer.Bytes;
        uVar2 = (pEVar3->Originals)._M_elems[uVar6].Column;
        bVar5 = GrowingAlignedDataBuffer::GrowZeroPadded(this_01,this->TheAllocator,uVar1);
        if (!bVar5) goto LAB_0013d779;
        pOVar8 = (pEVar3->Originals)._M_elems + uVar6;
        if (sumIndex == 0) {
          gf256_add_mem(this_01->Data,(pOVar8->Buffer).Data,uVar1);
        }
        else {
          uVar4 = (ulong)(uVar2 * 199) % 0xfd;
          y = (char)uVar4 + '\x03';
          if (sumIndex == 2) {
            y = GF256Ctx.GF256_SQR_TABLE[uVar4 + 3];
          }
          gf256_muladd_mem(this_01->Data,y,(pOVar8->Buffer).Data,uVar1);
        }
        uVar7 = uVar7 + 8;
      } while (uVar7 < elementEnd);
      this->Lanes[laneIndex].NextElement[sumIndex] = uVar7;
    }
    else {
LAB_0013d779:
      this->EmergencyDisabled = true;
    }
  }
  return this->Lanes[laneIndex].Sum + sumIndex;
}

Assistant:

const GrowingAlignedDataBuffer* EncoderPacketWindow::GetSum(unsigned laneIndex, unsigned sumIndex, unsigned elementEnd)
{
    EncoderColumnLane& lane = Lanes[laneIndex];
    unsigned element = lane.NextElement[sumIndex];
    SIAMESE_DEBUG_ASSERT(element % kColumnLaneCount == laneIndex);
    SIAMESE_DEBUG_ASSERT(element < Count + kColumnLaneCount);

    if (element < elementEnd)
    {
        GrowingAlignedDataBuffer& sum = lane.Sum[sumIndex];

        // Grow this sum for this lane to fit new (larger) data if needed
        if (lane.LongestPacket > 0 &&
            !sum.GrowZeroPadded(TheAllocator, lane.LongestPacket))
        {
            EmergencyDisabled = true;
            goto ExitSum;
        }

        do
        {
            Logger.Info("Lane ", laneIndex, " sum ", sumIndex, " accumulating column: ", ColumnStart + element);

            OriginalPacket* original = GetWindowElement(element);
            const unsigned column    = original->Column;
            unsigned addBytes        = original->Buffer.Bytes;

            if (!sum.GrowZeroPadded(TheAllocator, addBytes))
            {
                EmergencyDisabled = true;
                goto ExitSum;
            }

            SIAMESE_DEBUG_ASSERT(original->Buffer.Bytes <= sum.Bytes || element < FirstUnremovedElement);

            // Sum += PacketData
            if (sumIndex == 0) {
                gf256_add_mem(sum.Data, original->Buffer.Data, addBytes);
            }
            else
            {
                // Sum += CX[2] * PacketData
                uint8_t CX = GetColumnValue(column);
                if (sumIndex == 2) {
                    CX = gf256_sqr(CX);
                }
                gf256_muladd_mem(sum.Data, CX, original->Buffer.Data, addBytes);
            }

            SIAMESE_DEBUG_ASSERT(original->Column % kColumnLaneCount == laneIndex);
            element += kColumnLaneCount;
        } while (element < elementEnd);

        // Store next element to accumulate
        lane.NextElement[sumIndex] = element;
    }

ExitSum:
    return &lane.Sum[sumIndex];
}